

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

int cifra_chacha20poly1305_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key,void *iv)

{
  int iVar1;
  void *iv_local;
  void *key_local;
  int is_enc_local;
  ptls_aead_context_t *ctx_local;
  
  iVar1 = chacha20poly1305_setup_crypto
                    (ctx,is_enc,key,iv,&ptls_minicrypto_chacha20,cifra_poly1305_init,
                     cifra_poly1305_update,cifra_poly1305_finish);
  return iVar1;
}

Assistant:

static int cifra_chacha20poly1305_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key, const void *iv)
{
    return chacha20poly1305_setup_crypto(ctx, is_enc, key, iv, &ptls_minicrypto_chacha20, cifra_poly1305_init,
                                         cifra_poly1305_update, cifra_poly1305_finish);
}